

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O0

void __thiscall
chatra::emb::io::StandardFileCommon::seek
          (StandardFileCommon *this,ptrdiff_t offset,SeekOrigin origin)

{
  ulong uVar1;
  int iVar2;
  UnsupportedOperationException *this_00;
  IllegalArgumentException *this_01;
  NativeException *this_02;
  ulong local_28;
  ptrdiff_t newPosition;
  SeekOrigin origin_local;
  ptrdiff_t offset_local;
  StandardFileCommon *this_local;
  
  if (this->fp == (FILE *)0x0) {
    this_00 = (UnsupportedOperationException *)__cxa_allocate_exception(0x28);
    memset(this_00,0,0x28);
    UnsupportedOperationException::UnsupportedOperationException(this_00);
    __cxa_throw(this_00,&UnsupportedOperationException::typeinfo,
                UnsupportedOperationException::~UnsupportedOperationException);
  }
  local_28 = 0;
  uVar1 = offset;
  if (origin != Begin) {
    if (origin == End) {
      uVar1 = this->length + offset;
    }
    else {
      uVar1 = local_28;
      if (origin == Current) {
        uVar1 = this->current + offset;
      }
    }
  }
  local_28 = uVar1;
  if ((-1 < (long)local_28) && (local_28 <= this->length)) {
    iVar2 = fseek((FILE *)this->fp,local_28,0);
    if (iVar2 == 0) {
      this->current = local_28;
      return;
    }
    (*(this->super_IFile)._vptr_IFile[2])();
    this_02 = (NativeException *)__cxa_allocate_exception(0x28);
    memset(this_02,0,0x28);
    NativeException::NativeException(this_02);
    __cxa_throw(this_02,&NativeException::typeinfo,NativeException::~NativeException);
  }
  this_01 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
  IllegalArgumentException::IllegalArgumentException(this_01,"specified offset is out of range");
  __cxa_throw(this_01,&IllegalArgumentException::typeinfo,
              IllegalArgumentException::~IllegalArgumentException);
}

Assistant:

void seek(ptrdiff_t offset, SeekOrigin origin) override {
		if (fp == nullptr)
			throw UnsupportedOperationException();

		ptrdiff_t newPosition = 0;
		switch (origin) {
		case SeekOrigin::Begin:
			newPosition = offset;  break;
		case SeekOrigin::End:
			newPosition = length + offset;  break;
		case SeekOrigin::Current:
			newPosition = current + offset;  break;
		}
		if (newPosition < 0 || length < static_cast<size_t>(newPosition))
			throw IllegalArgumentException("specified offset is out of range");

		if (std::fseek(fp, static_cast<long>(newPosition), SEEK_SET)) {
			close();
			throw NativeException();
		}

		current = static_cast<size_t>(newPosition);
	}